

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O2

void __thiscall
Molecules::AddTriple(Molecules *this,KEY_ID s,KEY_ID p,KEY_ID o,KEY_ID prov,unsigned_short scope)

{
  pointer *this_00;
  _Rb_tree_color _type;
  TYPE_ID TVar1;
  TYPE_ID o_00;
  iterator iVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_01;
  iterator iVar5;
  _Rb_tree_node_base *p_Var6;
  _Self __tmp;
  undefined1 __v [8];
  _Self __tmp_1;
  pair<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
  local_130;
  undefined1 local_f8 [8];
  multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  tripleTmpls;
  vector<unsigned_long,_std::allocator<unsigned_long>_> molecules_to_search_in;
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  tt;
  ulong local_68;
  undefined1 auStack_58 [8];
  vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  elems;
  KEY_ID s_local;
  KEY_ID o_local;
  
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tripleTmpls;
  tripleTmpls._M_t._M_impl._0_4_ = 0;
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  tt._M_t._M_impl.super__Rb_tree_header._M_node_count = prov;
  elems.
  super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)s;
  s_local = o;
  TVar1 = KeyManager::GetType(s);
  o_00 = KeyManager::GetType(o);
  TemplateManager::GetTemplates
            ((TemplateManager *)diplo::TM,TVar1,p,o_00,scope,
             (multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              *)local_f8);
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  molecules_to_search_in.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  molecules_to_search_in.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
          ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
                  *)diplo::M,
                 (key_type *)
                 &elems.
                  super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2._M_node != (_Base_ptr)(diplo::M + 8)) {
    elems.
    super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    elems.
    super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
      TVar1 = KeyManager::GetType((KEY_ID)elems.
                                          super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      TypesManager::AddElement
                ((TypesManager *)diplo::TypesM,TVar1,
                 (KEY_ID)elems.
                         super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      TVar1 = KeyManager::GetType(s_local);
      TypesManager::AddElement((TypesManager *)diplo::TypesM,TVar1,s_local);
      local_68 = 0xffffffffffffffff;
      for (p_Var4 = tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var4 != (_Rb_tree_node_base *)&tripleTmpls;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        _type = p_Var4[1]._M_color;
        __v = auStack_58;
        if (local_68 != _type) {
          this_01 = &TypesManager::GetElementsOfType((TypesManager *)diplo::TypesM,_type)->_M_h;
          if ((undefined1  [8])
              elems.
              super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
              ._M_impl.super__Vector_impl_data._M_start != auStack_58) {
            elems.
            super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
          }
          for (p_Var6 = *(_Rb_tree_node_base **)(iVar2._M_node + 2); __v = auStack_58,
              local_68 = (ulong)_type, p_Var6 != (_Rb_tree_node_base *)&iVar2._M_node[1]._M_left;
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
            iVar5 = std::
                    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(this_01,*(key_type **)(p_Var6 + 1));
            if (iVar5.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0)
            {
              std::
              vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
              ::push_back((vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                           *)auStack_58,(value_type *)(p_Var6 + 1));
            }
          }
        }
        for (; __v != (undefined1  [8])
                      elems.
                      super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            __v = (undefined1  [8])((long)__v + 8)) {
          Molecule::FindEntityAndAddNext
                    (&(*(pair<const_unsigned_long,_Molecule> **)__v)->second,
                     (size_t)p_Var4[1]._M_parent,s_local,
                     (KEY_ID)elems.
                             super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     tt._M_t._M_impl.super__Rb_tree_header._M_node_count,scope);
          iVar3 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
                  ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
                          *)diplo::M,&s_local);
          if (iVar3._M_node == (_Base_ptr)(diplo::M + 8)) {
            tt._M_t._M_impl._0_4_ = 0;
            tt._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            tt._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            tt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tt;
            tt._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            this_00 = &molecules_to_search_in.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            tt._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 tt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::
            _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
            ::_M_insert_unique<std::pair<unsigned_long_const,Molecule>*const&>
                      ((_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
                        *)this_00,(pair<const_unsigned_long,_Molecule> **)__v);
            local_130.first = s_local;
            std::
            _Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
            ::_Rb_tree(&local_130.second._M_t,
                       (_Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                        *)this_00);
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>>
            ::
            _M_emplace_unique<std::pair<unsigned_long,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>>
                        *)this,&local_130);
            std::
            _Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
            ::~_Rb_tree(&local_130.second._M_t);
            std::
            _Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
            ::~_Rb_tree((_Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                         *)&molecules_to_search_in.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            std::
            _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
            ::_M_insert_unique<std::pair<unsigned_long_const,Molecule>*const&>
                      ((_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
                        *)&iVar3._M_node[1]._M_parent,(pair<const_unsigned_long,_Molecule> **)__v);
          }
        }
      }
    }
    std::
    _Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
    ::~_Vector_base((_Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                     *)auStack_58);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               *)local_f8);
  return;
}

Assistant:

void Molecules::AddTriple(KEY_ID s, KEY_ID p, KEY_ID o, KEY_ID prov, unsigned short int scope) {
	multimap<TYPE_ID, size_t> tripleTmpls;
	diplo::TM.GetTemplates(diplo::KM.GetType(s), p, diplo::KM.GetType(o), scope, &tripleTmpls);


	vector<KEY_ID> molecules_to_search_in;

	map <KEY_ID, set< pair<const KEY_ID, Molecule>* > >::iterator it_inv_molecules = diplo::M.inv_molecules.find(s);
	set< pair<const KEY_ID, Molecule>*  > * molecules_where_S_exists;

	if (it_inv_molecules != diplo::M.inv_molecules.end() ) {
		molecules_where_S_exists = &(it_inv_molecules->second);
	} else return; //this subject DOES NOT exist as an object in any triple


	vector< pair<const KEY_ID, Molecule>*  > elems;
	if (tripleTmpls.size() > 0) {

		diplo::TypesM.AddElement(KeyManager::GetType( s ), s );
		diplo::TypesM.AddElement(KeyManager::GetType( o ), o );

		unordered_set< KEY_ID > * el;
		size_t t = -1;

		for (multimap<TYPE_ID, size_t>::iterator it = tripleTmpls.begin(); it !=  tripleTmpls.end(); it ++) { //scan all templates where TRIPLE can exist

			if (t != (size_t)it->first) {
				t = it->first;
				el = diplo::TypesM.GetElementsOfType( t  ); // get list of molecules where triple can be in contexst of the above template
				elems.clear();

				for (set < pair<const KEY_ID, Molecule>* >::iterator it2 = molecules_where_S_exists->begin(); it2 != molecules_where_S_exists->end(); it2++) {
					//check if in the molecule SUBJECT exists as an OBJECT, if YES, that is what we want!!
					if ( el->find( (*it2)->first ) != el->end() ) {
						elems.push_back( *it2 );
					}
				}





			}



			for (vector< pair<const KEY_ID, Molecule>*  >::iterator it2 = elems.begin(); it2 != elems.end(); it2++) {

				(*it2)->second.FindEntityAndAddNext(it->second, o, s, prov, scope); //it has to be added there, molecules are preselected so it is just a question of finding right place to insert the triple
				//so then we can add also to the inverted index, that THE OBJECT (o) in THE MOLECULE pointer by *it2
				map <KEY_ID, set< pair<const KEY_ID, Molecule>* > >::iterator it_inv_molecules = diplo::M.inv_molecules.find(o);

				if (it_inv_molecules == diplo::M.inv_molecules.end() ) {
					set< pair<const KEY_ID, Molecule>* > tt;
					tt.insert( *it2 ) ;
					inv_molecules.insert( pair<KEY_ID, set< pair<const KEY_ID, Molecule>* > > (o, tt ) );
				} else {
					it_inv_molecules->second.insert( *it2 ) ;
				}


			}



		}
	}
}